

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmcp(fitsfile *gfptr,fitsfile *mfptr,long member,int cpopt,int *status)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  fitsfile *in_RSI;
  int *in_R8;
  fitsfile *tmpfptr;
  char value [81];
  char keyname [81];
  char comment [73];
  char card [81];
  char extname [71];
  char *incList [2];
  int i;
  int hdutype;
  int hdunum;
  int keypos;
  int numkeys;
  int *in_stack_000017f0;
  fitsfile **in_stack_000017f8;
  long in_stack_00001800;
  fitsfile *in_stack_00001808;
  int *in_stack_00001ba0;
  int in_stack_00001bac;
  long in_stack_00001bb0;
  fitsfile *in_stack_00001bb8;
  int *in_stack_000025f0;
  int in_stack_000025fc;
  fitsfile *in_stack_00002600;
  fitsfile *in_stack_00002608;
  int *in_stack_00005b90;
  int in_stack_00005b9c;
  fitsfile *in_stack_00005ba0;
  fitsfile *in_stack_00005ba8;
  int *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  fitsfile *outfptr;
  fitsfile *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  fitsfile *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  fitsfile *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  fitsfile *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  fitsfile *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  char **in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  fitsfile *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  LONGLONG in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  fitsfile *in_stack_fffffffffffffed8;
  char local_a8 [32];
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  int local_3c [3];
  int *local_30;
  int local_24;
  fitsfile *local_18;
  
  local_3c[2] = 0;
  local_3c[1] = 0;
  local_3c[0] = 0;
  outfptr = (fitsfile *)0x0;
  if (*in_R8 != 0) {
    return *in_R8;
  }
  local_30 = in_R8;
  local_24 = in_ECX;
  local_18 = in_RSI;
  iVar1 = ffgmop(in_stack_00001808,in_stack_00001800,in_stack_000017f8,in_stack_000017f0);
  *local_30 = iVar1;
  if (*local_30 == 0) {
    iVar1 = ffgkys(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    *local_30 = iVar1;
    if (*local_30 == 0xca) {
      local_a8[0] = '\0';
      *local_30 = 0;
    }
    else if (*local_30 != 0) goto LAB_001cfd7f;
    prepare_keyvalue((char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    iVar1 = fits_strcasecmp((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                            (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (iVar1 == 0) {
      iVar1 = ffgtcp(in_stack_00005ba8,in_stack_00005ba0,in_stack_00005b9c,in_stack_00005b90);
      *local_30 = iVar1;
    }
    else {
      iVar1 = ffcopy(in_stack_fffffffffffffde8,outfptr,in_stack_fffffffffffffddc,
                     (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      *local_30 = iVar1;
      ffgrec((fitsfile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd4,(char *)in_stack_fffffffffffffdc8,(int *)0x1cf8e1);
      while (*local_30 == 0) {
        in_stack_fffffffffffffdc8 = local_30;
        iVar1 = ffgnxk(in_stack_fffffffffffffeb8,
                       (char **)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
                       ,(char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
        *local_30 = iVar1;
        iVar1 = ffghps((fitsfile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       in_stack_fffffffffffffdc8,(int *)0x1cf956);
        *local_30 = iVar1;
        iVar1 = ffgkyn(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                       (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (char *)in_stack_fffffffffffffea0,
                       (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe90);
        *local_30 = iVar1;
        iVar1 = ffgrec((fitsfile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                       in_stack_fffffffffffffdd4,(char *)in_stack_fffffffffffffdc8,(int *)0x1cf9c9);
        *local_30 = iVar1;
        iVar1 = ffdkey(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
        *local_30 = iVar1;
      }
      if (*local_30 == 0xca) {
        *local_30 = 0;
      }
      if (*local_30 != 0) goto LAB_001cfd7f;
    }
    sVar2 = strlen(local_a8);
    if (sVar2 == 0) {
      iVar1 = ffghdn(outfptr,local_3c);
      if (iVar1 == 1) {
        strcpy(local_a8,"PRIMARY");
        iVar1 = ffpkys(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        *local_30 = iVar1;
      }
      else {
        strcpy(local_a8,"DEFAULT");
        iVar1 = ffpkys(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        *local_30 = iVar1;
      }
    }
    ffghdn(local_18,local_3c);
    ffghdt((fitsfile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
           (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
           in_stack_fffffffffffffdc8);
    iVar1 = ffmkyj(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   &in_stack_fffffffffffffeb8->HDUposition);
    *local_30 = iVar1;
    if (*local_30 == 0xca) {
      *local_30 = 0;
      iVar1 = ffgkys(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      *local_30 = iVar1;
      iVar1 = ffikyj(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     (LONGLONG)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68);
      *local_30 = iVar1;
    }
    if (*local_30 == 0) {
      do {
        iVar1 = ffmnhd(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                       (char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                       in_stack_fffffffffffffe38);
      } while (iVar1 == 0);
      *local_30 = 0;
      ffmahd(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe30);
      iVar1 = ffmkyj(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     &in_stack_fffffffffffffeb8->HDUposition);
      *local_30 = iVar1;
      if (local_24 == 0) {
        iVar1 = ffgtam(in_stack_00002608,in_stack_00002600,in_stack_000025fc,in_stack_000025f0);
        *local_30 = iVar1;
        in_stack_fffffffffffffddc = local_24;
      }
      else {
        in_stack_fffffffffffffddc = local_24;
        if (local_24 != 1) {
          if (local_24 == 2) {
            iVar1 = ffgmrm(in_stack_00001bb8,in_stack_00001bb0,in_stack_00001bac,in_stack_00001ba0);
            *local_30 = iVar1;
            iVar1 = ffgtam(in_stack_00002608,in_stack_00002600,in_stack_000025fc,in_stack_000025f0);
            *local_30 = iVar1;
            in_stack_fffffffffffffddc = local_24;
          }
          else {
            *local_30 = 0x15b;
            ffpmsg((char *)0x1cfd7d);
            in_stack_fffffffffffffddc = local_24;
          }
        }
      }
    }
  }
LAB_001cfd7f:
  if (outfptr != (fitsfile *)0x0) {
    ffclos((fitsfile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
           (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  }
  return *local_30;
}

Assistant:

int ffgmcp(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   fitsfile *mfptr,  /* FITS file pointer to new member
				FITS file                                    */
	   long      member, /* member ID (row num) within grouping table    */
	   int       cpopt,  /* code specifying copy options:
				OPT_MCP_ADD  (0) ==> add copied member to the
 				                     grouping table
				OPT_MCP_NADD (1) ==> do not add member copy to
				                     the grouping table
				OPT_MCP_REPL (2) ==> replace current member
				                     entry with member copy  */
	   int      *status) /* return status code                           */
	   
/*
  copy a member HDU of a grouping table to a new FITS file. The grouping table
  must be the CHDU of the FITS file pointed to by gfptr. The copy of the
  group member shall be appended to the end of the FITS file pointed to by
  mfptr. If the cpopt parameter is set to OPT_MCP_ADD then the copy of the 
  member is added to the grouping table as a new member, if OPT_MCP_NADD 
  then the copied member is not added to the grouping table, and if 
  OPT_MCP_REPL then the copied member is used to replace the original member.
  The copied member HDU also has its EXTVER value updated so that its
  combination of XTENSION, EXTNAME and EXVTER is unique within its new
  FITS file.
*/

{
  int numkeys = 0;
  int keypos  = 0;
  int hdunum  = 0;
  int hdutype = 0;
  int i;
  
  char *incList[] = {"GRPID#","GRPLC#"};
  char  extname[FLEN_VALUE];
  char  card[FLEN_CARD];
  char  comment[FLEN_COMMENT];
  char  keyname[FLEN_CARD];
  char  value[FLEN_CARD];

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* open the member HDU to be copied */

      *status = fits_open_member(gfptr,member,&tmpfptr,status);

      if(*status != 0) continue;

      /*
	if the member is a grouping table then copy it with a call to
	fits_copy_group() using the "copy only the grouping table" option

	if it is not a grouping table then copy the hdu with fits_copy_hdu()
	remove all GRPIDn and GRPLCn keywords, and update the EXTVER keyword
	value
      */

      /* get the member HDU's EXTNAME value */

      *status = fits_read_key_str(tmpfptr,"EXTNAME",extname,comment,status);

      /* if no EXTNAME value was found then set the extname to a null string */

      if(*status == KEY_NO_EXIST) 
	{
	  extname[0] = 0;
	  *status    = 0;
	}
      else if(*status != 0) continue;

      prepare_keyvalue(extname);

      /* if a grouping table then copy with fits_copy_group() */

      if(fits_strcasecmp(extname,"GROUPING") == 0)
	*status = fits_copy_group(tmpfptr,mfptr,OPT_GCP_GPT,status);
      else
	{
	  /* copy the non-grouping table HDU the conventional way */

	  *status = fits_copy_hdu(tmpfptr,mfptr,0,status);

	  ffgrec(mfptr,0,card,status);

	  /* delete all the GRPIDn and GRPLCn keywords in the copied HDU */

	  while(*status == 0)
	    {
	      *status = fits_find_nextkey(mfptr,incList,2,NULL,0,card,status);
	      *status = fits_get_hdrpos(mfptr,&numkeys,&keypos,status);  
	      /* SPR 1738 */
	      *status = fits_read_keyn(mfptr,keypos-1,keyname,value,
				       comment,status);
	      *status = fits_read_record(mfptr,keypos-1,card,status);
	      *status = fits_delete_key(mfptr,keyname,status);
	    }

	  if(*status == KEY_NO_EXIST) *status = 0;
	  if(*status != 0) continue;
	}

      /* 
	 if the member HDU does not have an EXTNAME keyword then add one
	 with a default value
      */

      if(strlen(extname) == 0)
	{
	  if(fits_get_hdu_num(tmpfptr,&hdunum) == 1)
	    {
	      strcpy(extname,"PRIMARY");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "HDU was Formerly a Primary Array",
					   status);
	    }
	  else
	    {
	      strcpy(extname,"DEFAULT");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "default EXTNAME set by CFITSIO",
					   status);
	    }
	}

      /* 
	 update the member HDU's EXTVER value (add it if not present)
      */

      fits_get_hdu_num(mfptr,&hdunum);
      fits_get_hdu_type(mfptr,&hdutype,status);

      /* set the EXTVER value to 0 for now */

      *status = fits_modify_key_lng(mfptr,"EXTVER",0,NULL,status);

      /* if the EXTVER keyword was not found then add it */

      if(*status == KEY_NO_EXIST)
	{
	  *status = 0;
	  *status = fits_read_key_str(mfptr,"EXTNAME",extname,comment,
				      status);
	  *status = fits_insert_key_lng(mfptr,"EXTVER",0,
					"Extension version ID",status);
	}

      if(*status != 0) continue;

      /* find the first available EXTVER value for the copied HDU */
 
      for(i = 1; fits_movnam_hdu(mfptr,hdutype,extname,i,status) == 0; ++i);

      *status = 0;

      fits_movabs_hdu(mfptr,hdunum,&hdutype,status);

      /* reset the copied member HDUs EXTVER value */

      *status = fits_modify_key_lng(mfptr,"EXTVER",(long)i,NULL,status);    

      /*
	perform member copy operations that are dependent upon the cpopt
	parameter value
      */

      switch(cpopt)
	{
	case OPT_MCP_ADD:

	  /*
	    add the copied member to the grouping table, leaving the
	    entry for the original member in place
	  */

	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	case OPT_MCP_NADD:

	  /*
	    nothing to do for this copy option
	  */

	  break;

	case OPT_MCP_REPL:

	  /*
	    remove the original member from the grouping table and add the
	    copied member in its place
	  */

	  *status = fits_remove_member(gfptr,member,OPT_RM_ENTRY,status);
	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the cmopt parameter (ffgmcp)");

	  break;
	}

    }while(0);
      
  if(tmpfptr != NULL) 
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}